

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

void MyCPUID(UInt32 function,UInt32 *a,UInt32 *b,UInt32 *c,UInt32 *d)

{
  UInt32 *pUVar1;
  UInt32 UVar2;
  UInt32 UVar3;
  UInt32 UVar4;
  UInt32 *d_local;
  UInt32 *c_local;
  UInt32 *b_local;
  UInt32 *a_local;
  UInt32 function_local;
  
  if (function == 0) {
    pUVar1 = (UInt32 *)cpuid_basic_info(0);
  }
  else if (function == 1) {
    pUVar1 = (UInt32 *)cpuid_Version_info(1);
  }
  else if (function == 2) {
    pUVar1 = (UInt32 *)cpuid_cache_tlb_info(2);
  }
  else if (function == 3) {
    pUVar1 = (UInt32 *)cpuid_serial_info(3);
  }
  else if (function == 4) {
    pUVar1 = (UInt32 *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (function == 5) {
    pUVar1 = (UInt32 *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (function == 6) {
    pUVar1 = (UInt32 *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (function == 7) {
    pUVar1 = (UInt32 *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (function == 9) {
    pUVar1 = (UInt32 *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (function == 10) {
    pUVar1 = (UInt32 *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (function == 0xb) {
    pUVar1 = (UInt32 *)cpuid_Extended_Topology_info(0xb);
  }
  else if (function == 0xd) {
    pUVar1 = (UInt32 *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (function == 0xf) {
    pUVar1 = (UInt32 *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (function == 0x80000002) {
    pUVar1 = (UInt32 *)cpuid_brand_part1_info(0x80000002);
  }
  else if (function == 0x80000003) {
    pUVar1 = (UInt32 *)cpuid_brand_part2_info(0x80000003);
  }
  else if (function == 0x80000004) {
    pUVar1 = (UInt32 *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    pUVar1 = (UInt32 *)cpuid(function);
  }
  UVar2 = pUVar1[1];
  UVar3 = pUVar1[2];
  UVar4 = pUVar1[3];
  *a = *pUVar1;
  *b = UVar2;
  *c = UVar4;
  *d = UVar3;
  return;
}

Assistant:

void MyCPUID(UInt32 function, UInt32 *a, UInt32 *b, UInt32 *c, UInt32 *d)
{
  #ifdef USE_ASM

  #ifdef _MSC_VER

  UInt32 a2, b2, c2, d2;
  __asm xor EBX, EBX;
  __asm xor ECX, ECX;
  __asm xor EDX, EDX;
  __asm mov EAX, function;
  __asm cpuid;
  __asm mov a2, EAX;
  __asm mov b2, EBX;
  __asm mov c2, ECX;
  __asm mov d2, EDX;

  *a = a2;
  *b = b2;
  *c = c2;
  *d = d2;

  #else

  __asm__ __volatile__ (
  #if defined(MY_CPU_X86) && defined(__PIC__)
    "mov %%ebx, %%edi;"
    "cpuid;"
    "xchgl %%ebx, %%edi;"
    : "=a" (*a) ,
      "=D" (*b) ,
  #else
    "cpuid"
    : "=a" (*a) ,
      "=b" (*b) ,
  #endif
      "=c" (*c) ,
      "=d" (*d)
    : "0" (function)) ;

  #endif
  
  #else

  int CPUInfo[4];
  __cpuid(CPUInfo, function);
  *a = CPUInfo[0];
  *b = CPUInfo[1];
  *c = CPUInfo[2];
  *d = CPUInfo[3];

  #endif
}